

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__socket(int domain,int type,int protocol)

{
  int *piVar1;
  int in_EDX;
  uint in_ESI;
  int in_EDI;
  int err;
  int sockfd;
  int local_18;
  int local_4;
  
  local_4 = socket(in_EDI,in_ESI | 0x80800,in_EDX);
  if (local_4 == -1) {
    piVar1 = __errno_location();
    if (*piVar1 == 0x16) {
      local_4 = socket(in_EDI,in_ESI,in_EDX);
      if (local_4 == -1) {
        piVar1 = __errno_location();
        local_4 = -*piVar1;
      }
      else {
        local_18 = uv__nonblock(in_EDX,local_4);
        if (local_18 == 0) {
          local_18 = uv__cloexec(in_EDX,local_4);
        }
        if (local_18 != 0) {
          uv__close(in_ESI);
          local_4 = local_18;
        }
      }
    }
    else {
      piVar1 = __errno_location();
      local_4 = -*piVar1;
    }
  }
  return local_4;
}

Assistant:

int uv__socket(int domain, int type, int protocol) {
  int sockfd;
  int err;

#if defined(SOCK_NONBLOCK) && defined(SOCK_CLOEXEC)
  sockfd = socket(domain, type | SOCK_NONBLOCK | SOCK_CLOEXEC, protocol);
  if (sockfd != -1)
    return sockfd;

  if (errno != EINVAL)
    return -errno;
#endif

  sockfd = socket(domain, type, protocol);
  if (sockfd == -1)
    return -errno;

  err = uv__nonblock(sockfd, 1);
  if (err == 0)
    err = uv__cloexec(sockfd, 1);

  if (err) {
    uv__close(sockfd);
    return err;
  }

#if defined(SO_NOSIGPIPE)
  {
    int on = 1;
    setsockopt(sockfd, SOL_SOCKET, SO_NOSIGPIPE, &on, sizeof(on));
  }
#endif

  return sockfd;
}